

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void drawnumber_float(t_drawnumber *x,t_floatarg f)

{
  bool bVar1;
  int viswas;
  t_floatarg f_local;
  t_drawnumber *x_local;
  
  if (((x->x_vis).fd_type == '\x01') && ((x->x_vis).fd_var == '\0')) {
    bVar1 = (x->x_vis).fd_un.fd_float != 0.0;
    if ((((f == 0.0) && (!NAN(f))) || (!bVar1)) && (((f != 0.0 || (NAN(f))) || (bVar1)))) {
      canvas_redrawallfortemplatecanvas(x->x_canvas,2);
      fielddesc_setfloat_const(&x->x_vis,(float)(f != 0.0));
      canvas_redrawallfortemplatecanvas(x->x_canvas,1);
    }
  }
  else {
    pd_error(x,"global vis/invis for a template with variable visibility");
  }
  return;
}

Assistant:

void drawnumber_float(t_drawnumber *x, t_floatarg f)
{
    int viswas;
    if (x->x_vis.fd_type != A_FLOAT || x->x_vis.fd_var)
    {
        pd_error(x, "global vis/invis for a template with variable visibility");
        return;
    }
    viswas = (x->x_vis.fd_un.fd_float != 0);

    if ((f != 0 && viswas) || (f == 0 && !viswas))
        return;
    canvas_redrawallfortemplatecanvas(x->x_canvas, 2);
    fielddesc_setfloat_const(&x->x_vis, (f != 0));
    canvas_redrawallfortemplatecanvas(x->x_canvas, 1);
}